

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O0

int main(void)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  initializer_list<int> __l;
  time_t tVar3;
  istream *piVar4;
  ulong uVar5;
  reference pvVar6;
  int local_94;
  undefined1 local_90 [4];
  int i;
  vector<int,_std::allocator<int>_> arr2_1;
  int *arr_1;
  allocator<int> local_5d;
  int local_5c;
  int local_58;
  int local_54;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> arr2;
  int arr [3];
  int c;
  int b;
  int a;
  int n;
  
  a = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  std::istream::operator>>((istream *)&std::cin,&b);
  if (b == 3) {
    piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&c);
    piVar4 = (istream *)std::istream::operator>>(piVar4,arr + 2);
    std::istream::operator>>(piVar4,arr + 1);
    Bozo_sort(&c,arr + 2,arr + 1,ABC);
    arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = c;
    arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = arr[2];
    arr[0] = arr[1];
    Bozo_sort((int *)&arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,3,DESC);
    local_5c = c;
    local_58 = arr[2];
    local_54 = arr[1];
    local_50 = &local_5c;
    local_48 = 3;
    std::allocator<int>::allocator(&local_5d);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_40,__l,&local_5d);
    std::allocator<int>::~allocator(&local_5d);
    Bozo_sort((vector<int,_std::allocator<int>_> *)local_40,DESC);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)b;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)operator_new__(uVar5);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_90,(long)b);
    for (local_94 = 0; local_94 < b; local_94 = local_94 + 1) {
      std::istream::operator>>
                ((istream *)&std::cin,
                 arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + local_94);
      vVar1 = arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[local_94];
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_90,(long)local_94);
      *pvVar6 = vVar1;
    }
    Bozo_sort(arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,b,ABC);
    if (arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete__(arr2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  }
  return 0;
}

Assistant:

int main(){
    srand(time(NULL));
    int n;

    cin >> n;

    if (n == 3){
        int a,b,c;
        cin >> a >> b >> c;
        Bozo_sort(&a, &b, &c);
        int arr[] = {a,b,c};
        Bozo_sort(arr, 3, DESC);
        vector<int> arr2 ={a, b, c};
        Bozo_sort(arr2, DESC);
    } else {
        int *arr = new int[n];

        vector<int> arr2;
        arr2.resize(n);
        for (int i = 0; i < n; i++){
            cin >> arr[i];
            arr2[i] = arr[i];
        }

        Bozo_sort(arr, n);
//        Bozo_sort(arr2, DESC);


        delete[] arr;
    }
    return 0;
}